

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense_hash_set_unittests.cc
# Opt level: O0

void __thiscall
DenseHashSet_TestEmplaceHint_Test::~DenseHashSet_TestEmplaceHint_Test
          (DenseHashSet_TestEmplaceHint_Test *this)

{
  void *in_RDI;
  
  ~DenseHashSet_TestEmplaceHint_Test((DenseHashSet_TestEmplaceHint_Test *)0x10bb7c8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(DenseHashSet, TestEmplaceHint) {
	dense_hash_set<const char *> set;
	set.set_empty_key(nullptr);

	const char * str1 = "Hello";
	const char * str2 = "World";

	set.insert(str1);
	auto it = set.begin();
	set.emplace_hint(it, str2);

	ASSERT_EQ(set.size(), 2ul);
}